

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O3

size_t GetUTF8Step(char firstbyte)

{
  size_t sVar1;
  
  sVar1 = 1;
  if (firstbyte < '\0') {
    sVar1 = 2;
    if (((firstbyte & 0xe0U) != 0xc0) && (sVar1 = 3, (firstbyte & 0xf0U) != 0xe0)) {
      sVar1 = 4;
      if (((firstbyte & 0xf8U) != 0xf0) && (sVar1 = 5, (firstbyte & 0xfcU) != 0xf8)) {
        sVar1 = 6;
        if ((firstbyte & 0xfeU) != 0xfc) {
          sVar1 = 0;
        }
        return sVar1;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t GetUTF8Step(char firstbyte)
{
	if ((firstbyte & 0x80) == 0x00)
	{
		return 1;
	}
	else if ((firstbyte & 0xe0) == 0xc0)
	{
		return 2;
	}
	else if ((firstbyte & 0xf0) == 0xe0)
	{
		return 3;
	}
	else if ((firstbyte & 0xf8) == 0xf0)
	{
		return 4;
	}
	else if ((firstbyte & 0xfc) == 0xf8)
	{
		return 5;
	}
	else if ((firstbyte & 0xfe) == 0xfc)
	{
		return 6;
	}
	return 0;
}